

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

XML_Convert_Result
ascii_toUtf8(ENCODING *UNUSED_enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char cVar1;
  char *pcVar2;
  
  while( true ) {
    pcVar2 = *fromP;
    if (fromLim <= pcVar2) {
      return XML_CONVERT_COMPLETED;
    }
    if (toLim <= *toP) break;
    *fromP = pcVar2 + 1;
    cVar1 = *pcVar2;
    pcVar2 = *toP;
    *toP = pcVar2 + 1;
    *pcVar2 = cVar1;
  }
  if (*toP != toLim) {
    return XML_CONVERT_COMPLETED;
  }
  return XML_CONVERT_OUTPUT_EXHAUSTED;
}

Assistant:

static enum XML_Convert_Result PTRCALL
ascii_toUtf8(const ENCODING *UNUSED_P(enc),
             const char **fromP, const char *fromLim,
             char **toP, const char *toLim)
{
  while (*fromP < fromLim && *toP < toLim)
    *(*toP)++ = *(*fromP)++;

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}